

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  DataType DVar2;
  DataType DVar3;
  float *pfVar4;
  pointer pMVar5;
  OperationType OVar6;
  TestMatrixType TVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 *puVar12;
  undefined4 *puVar13;
  char **ppcVar14;
  long *plVar15;
  ostream *poVar16;
  ostringstream *poVar17;
  ulong uVar18;
  string *psVar19;
  size_type *psVar20;
  EVP_PKEY_CTX *pEVar21;
  int row;
  int precision;
  float *pfVar22;
  undefined4 *puVar23;
  undefined8 uVar24;
  ShaderMatrixCase *pSVar25;
  EVP_PKEY_CTX *ctx_00;
  _Alloc_hider _Var26;
  int col;
  float *pfVar27;
  long lVar28;
  int row_3;
  undefined4 *puVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  pointer pbVar33;
  string *psVar34;
  bool bVar35;
  bool bVar36;
  float fVar37;
  DataType resultType;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  string inValue0;
  string operationValue1;
  string inValue1;
  ostringstream s;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_5d8 [8];
  ostringstream *local_5d0;
  DataType local_5c4;
  ShaderMatrixCase *local_5c0;
  Precision local_5b4;
  string local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  long local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  ulong *local_570;
  long local_568;
  ulong local_560 [2];
  string *local_550;
  char *local_548;
  char *local_540;
  char local_538;
  undefined7 uStack_537;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_528;
  char *local_510;
  long local_508;
  undefined4 *local_500;
  char *local_4f8;
  long local_4f0;
  char local_4e8;
  undefined7 uStack_4e7;
  char *local_4d8;
  long local_4d0;
  char local_4c8;
  undefined7 uStack_4c7;
  char *local_4b8;
  undefined8 local_4b0;
  char local_4a8;
  undefined7 uStack_4a7;
  string local_498;
  ulong local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_5d0 = (ostringstream *)local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_5d0 = (ostringstream *)local_320;
  }
  DVar2 = (this->m_in0).dataType;
  DVar3 = (this->m_in1).dataType;
  local_4f8 = &local_4e8;
  local_4f0 = 0;
  local_4e8 = '\0';
  local_4b8 = &local_4a8;
  local_4b0 = 0;
  local_4a8 = '\0';
  local_5c4 = TYPE_LAST;
  local_5b4 = (this->m_in0).precision;
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c0 = this;
  OVar6 = MatrixCaseUtils::getOperationType(this->m_op);
  local_508 = 1;
  if (OVar6 < OPERATIONTYPE_LAST) {
    local_508 = *(long *)(&DAT_01bff8a8 + (ulong)OVar6 * 8);
  }
  bVar35 = DVar2 - TYPE_DOUBLE_MAT2 < 9;
  bVar36 = DVar2 - TYPE_FLOAT_MAT2 < 9;
  local_548 = &local_538;
  local_540 = (char *)0x0;
  local_538 = '\0';
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = '\0';
  local_5c4 = DVar2;
  if (((!bVar36 && !bVar35) || (8 < DVar3 - TYPE_FLOAT_MAT2 && 8 < DVar3 - TYPE_DOUBLE_MAT2)) &&
     ((OVar6 & ~OPERATIONTYPE_BINARY_FUNCTION) != OPERATIONTYPE_UNARY_PREFIX_OPERATOR)) {
    DVar2 = (local_5c0->m_in0).dataType;
    DVar3 = (local_5c0->m_in1).dataType;
    local_5c4 = DVar2;
    if (bVar36 || bVar35) {
      local_5c4 = DVar3;
      DVar3 = DVar2;
    }
    if (local_5c4 == TYPE_FLOAT) {
      local_5c4 = DVar3;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute highp vec4 a_position;\n",0x21);
  if ((local_5c0->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_color;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"varying mediump vec4 v_color;\n",0x1e);
  }
  local_500 = &s_constInMat4;
  puVar23 = &s_constInMat3;
  puVar29 = &s_constInMat2;
  lVar31 = 0;
  local_510 = ";\n";
  do {
    pSVar25 = local_5c0;
    lVar32 = 0x134;
    if (lVar31 == 0) {
      lVar32 = 0x128;
    }
    pcVar9 = glu::getPrecisionName
                       (*(Precision *)
                         ((long)&(local_5c0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 m_testCtx + lVar32));
    pcVar10 = glu::getDataTypeName
                        (*(DataType *)
                          ((long)&(pSVar25->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                  _vptr_TestNode + lVar32 + 4));
    local_550 = (string *)&local_4b8;
    if (lVar31 == 0) {
      local_550 = (string *)&local_4f8;
    }
    iVar8 = *(int *)((long)&(pSVar25->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar32);
    iVar30 = (int)lVar31;
    if (iVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"const ",6);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar10,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," in",3);
      poVar16 = (ostream *)std::ostream::operator<<(local_5d0,iVar30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," = ",3);
      switch(*(undefined4 *)
              ((long)&(local_5c0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                      _vptr_TestNode + lVar32 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (&local_498,(de *)&DAT_00000001,
                   (float)(&deqp::gles3::Functional::s_constInFloat)[lVar31],precision);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5d0,local_498._M_dataplus._M_p,local_498._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  ((ostream *)local_5d0,(Vector<float,_2> *)(&s_constInVec2 + lVar31));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  ((ostream *)local_5d0,(Vector<float,_3> *)((long)&s_constInVec3 + lVar31 * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  ((ostream *)local_5d0,(Vector<float,_4> *)(s_constInVec4 + lVar31 * 0x10));
        break;
      case 5:
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        puVar13 = puVar29;
        psVar19 = &local_498;
        lVar32 = 0;
        do {
          lVar28 = 0;
          do {
            ((Vector<tcu::Vector<float,_2>,_2> *)&psVar19->_M_dataplus)->m_data[lVar28].m_data[0] =
                 (float)puVar13[lVar28 * 2];
            lVar28 = lVar28 + 1;
          } while (lVar28 == 1);
          psVar19 = (string *)
                    (((Vector<tcu::Vector<float,_2>,_2> *)&psVar19->_M_dataplus)->m_data[0].m_data +
                    1);
          puVar13 = puVar13 + 1;
          bVar35 = lVar32 == 0;
          lVar32 = lVar32 + 1;
        } while (bVar35);
        MatrixCaseUtils::writeMatrixConstructor<2,2>
                  ((ostream *)local_5d0,(Matrix<float,_2,_2> *)&local_498);
        break;
      case 9:
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        local_478 = local_478 & 0xffffffff00000000;
        lVar32 = 0;
        puVar13 = puVar23;
        psVar19 = &local_498;
        do {
          lVar28 = 0;
          do {
            *(undefined4 *)
             ((long)((Vector<tcu::Vector<float,_3>,_3> *)&psVar19->_M_dataplus)->m_data[0].m_data +
             lVar28) = *(undefined4 *)((long)puVar13 + lVar28);
            lVar28 = lVar28 + 0xc;
          } while (lVar28 != 0x24);
          lVar32 = lVar32 + 1;
          psVar19 = (string *)
                    (((Vector<tcu::Vector<float,_3>,_3> *)&psVar19->_M_dataplus)->m_data[0].m_data +
                    1);
          puVar13 = puVar13 + 1;
        } while (lVar32 != 3);
        MatrixCaseUtils::writeMatrixConstructor<3,3>
                  ((ostream *)local_5d0,(Matrix<float,_3,_3> *)&local_498);
        break;
      case 0xd:
        local_468 = 0;
        uStack_460 = 0;
        local_478 = 0;
        uStack_470 = 0;
        local_498.field_2._M_allocated_capacity = 0;
        local_498.field_2._8_8_ = 0;
        local_498._M_dataplus._M_p = (pointer)0x0;
        local_498._M_string_length = 0;
        lVar32 = 0;
        puVar13 = local_500;
        psVar19 = &local_498;
        do {
          lVar28 = 0;
          do {
            *(undefined4 *)
             ((long)((Vector<tcu::Vector<float,_4>,_4> *)&psVar19->_M_dataplus)->m_data[0].m_data +
             lVar28) = *(undefined4 *)((long)puVar13 + lVar28);
            lVar28 = lVar28 + 0x10;
          } while (lVar28 != 0x40);
          lVar32 = lVar32 + 1;
          psVar19 = (string *)
                    (((Vector<tcu::Vector<float,_4>,_4> *)&psVar19->_M_dataplus)->m_data[0].m_data +
                    1);
          puVar13 = puVar13 + 1;
        } while (lVar32 != 4);
        MatrixCaseUtils::writeMatrixConstructor<4,4>
                  ((ostream *)local_5d0,(Matrix<float,_4,_4> *)&local_498);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,";\n",2);
      local_590 = &local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"in","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      std::ostream::operator<<(&local_498,iVar30);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
      std::ios_base::~ios_base(local_428);
      uVar24 = 0xf;
      if (local_590 != &local_580) {
        uVar24 = local_580._M_allocated_capacity;
      }
      if ((ulong)uVar24 < (ulong)(local_568 + local_588)) {
        uVar18 = 0xf;
        if (local_570 != local_560) {
          uVar18 = local_560[0];
        }
        if ((ulong)(local_568 + local_588) <= uVar18) {
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_570,0,(char *)0x0,(ulong)local_590);
          goto LAB_00efe817;
        }
      }
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_570);
LAB_00efe817:
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      puVar1 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_5b0.field_2._M_allocated_capacity = *puVar1;
        local_5b0.field_2._8_8_ = puVar12[3];
      }
      else {
        local_5b0.field_2._M_allocated_capacity = *puVar1;
        local_5b0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_5b0._M_string_length = puVar12[1];
      *puVar12 = puVar1;
      puVar12[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=(local_550,(string *)&local_5b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
      }
      if (local_570 != local_560) {
        operator_delete(local_570,local_560[0] + 1);
      }
      uVar24 = local_580._M_allocated_capacity;
      _Var26._M_p = (pointer)local_590;
      if (local_590 != &local_580) {
LAB_00efe8c1:
        operator_delete(_Var26._M_p,uVar24 + 1);
      }
    }
    else {
      if (iVar8 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"uniform ",8);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
        }
        else {
          sVar11 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
        }
        else {
          sVar11 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar10,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," u_in",5);
        poVar16 = (ostream *)std::ostream::operator<<(local_5d0,iVar30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
        local_590 = &local_580;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"u_in","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
        std::ostream::operator<<(&local_498,iVar30);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
        std::ios_base::~ios_base(local_428);
        uVar24 = 0xf;
        if (local_590 != &local_580) {
          uVar24 = local_580._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (ulong)(local_568 + local_588)) {
          uVar18 = 0xf;
          if (local_570 != local_560) {
            uVar18 = local_560[0];
          }
          if ((ulong)(local_568 + local_588) <= uVar18) {
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_570,0,(char *)0x0,(ulong)local_590);
            goto LAB_00efe817;
          }
        }
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_570)
        ;
        goto LAB_00efe817;
      }
      if (iVar8 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"attribute ",10);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar9,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        iVar8 = *(int *)((long)&(local_5c0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                _vptr_TestNode + lVar32 + 4);
        if (8 < iVar8 - 5U && 8 < iVar8 - 0x12U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"coords;\n",8);
          if ((local_5c0->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"varying ",8);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) +
                              0x2b8);
            }
            else {
              sVar11 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar9,sVar11)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) +
                              0x2b8);
            }
            else {
              sVar11 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,pcVar10,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320," v_coords;\n",0xb);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying ",8);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x430);
            }
            else {
              sVar11 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar11)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x430);
            }
            else {
              sVar11 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar10,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," v_coords;\n",0xb);
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"coords","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_528,&local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pcVar9 = "v_coords";
          if ((local_5c0->super_ShaderRenderCase).m_isVertexCase != false) {
            pcVar9 = "a_coords";
          }
          ppcVar14 = &local_4b8;
          if (lVar31 == 0) {
            ppcVar14 = &local_4f8;
          }
          std::__cxx11::string::_M_replace((ulong)local_550,0,ppcVar14[1],(ulong)pcVar9);
          goto LAB_00efee88;
        }
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
        if ((local_5c0->super_ShaderRenderCase).m_isVertexCase == false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"varying ",8);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar9,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_",3);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying ",8);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x430
                           );
          }
          else {
            sVar11 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x430
                           );
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_",3);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_5d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x430
                           );
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,pcVar10,(allocator<char> *)&local_5b0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_528
                     ,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar25 = local_5c0;
        bVar35 = (local_5c0->super_ShaderRenderCase).m_isVertexCase != false;
        pcVar9 = "v_";
        if (bVar35) {
          pcVar9 = "a_";
        }
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        pcVar10 = "";
        if (bVar35) {
          pcVar10 = "";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,pcVar9,pcVar10);
        glu::getDataTypeName
                  (*(DataType *)
                    ((long)&(pSVar25->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar32 + 4));
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_5b0);
        psVar20 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_498.field_2._M_allocated_capacity = *psVar20;
          local_498.field_2._8_8_ = plVar15[3];
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        }
        else {
          local_498.field_2._M_allocated_capacity = *psVar20;
          local_498._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_498._M_string_length = plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=(local_550,(string *)&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        uVar24 = local_5b0.field_2._M_allocated_capacity;
        _Var26._M_p = local_5b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_00efee88;
        goto LAB_00efe8c1;
      }
    }
LAB_00efee88:
    lVar31 = lVar31 + 1;
    local_500 = local_500 + 0x10;
    puVar23 = puVar23 + 9;
    puVar29 = puVar29 + 4;
  } while (lVar31 != local_508);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((local_5c0->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_FragColor = v_color;\n",0x19);
  }
  else if (local_528.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_528.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar33 = local_528.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_",3);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(pbVar33->_M_dataplus)._M_p,
                           pbVar33->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"a_",2);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(pbVar33->_M_dataplus)._M_p,pbVar33->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      pbVar33 = pbVar33 + 1;
    } while (pbVar33 !=
             local_528.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_5c0->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," tmpValue = ",0xc);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_4f8,local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
    std::__cxx11::string::_M_replace((ulong)&local_548,0,local_540,0x1bff997);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_548);
  }
  psVar34 = (string *)&local_4d8;
  std::__cxx11::string::_M_assign(psVar34);
  OVar6 = MatrixCaseUtils::getOperationType(local_5c0->m_op);
  switch(OVar6) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," res = ",7);
    poVar17 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_548,(long)local_540);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17," ",1);
    pcVar9 = MatrixCaseUtils::getOperationName(local_5c0->m_op);
    sVar11 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar9,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17," ",1);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," res = ",7);
    pcVar9 = MatrixCaseUtils::getOperationName(local_5c0->m_op);
    sVar11 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"(",1);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_548,(long)local_540);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_4d8,local_4d0);
    lVar31 = 3;
    local_510 = ");\n";
    goto LAB_00eff857;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," res = ",7);
    pcVar9 = MatrixCaseUtils::getOperationName(local_5c0->m_op);
    sVar11 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    psVar34 = (string *)&local_548;
    poVar17 = local_5d0;
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," res = ",7);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_548,(long)local_540);
    pcVar9 = MatrixCaseUtils::getOperationName(local_5c0->m_op);
    sVar11 = strlen(pcVar9);
    lVar31 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar9,sVar11);
    goto LAB_00eff857;
  case OPERATIONTYPE_ASSIGNMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
    pcVar9 = glu::getPrecisionName(local_5b4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    pcVar9 = glu::getDataTypeName(local_5c4);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_5d0 + (int)*(undefined8 *)(*(long *)local_5d0 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," res = ",7);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_548,(long)local_540);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\tres ",5);
    pcVar9 = MatrixCaseUtils::getOperationName(local_5c0->m_op);
    sVar11 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,pcVar9,sVar11);
    poVar17 = local_5d0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
    break;
  default:
    goto switchD_00eff1b7_default;
  }
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar17,*(char **)psVar34,*(long *)(psVar34 + 8));
  lVar31 = 2;
LAB_00eff857:
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_510,lVar31);
switchD_00eff1b7_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"\t",1);
  uVar18 = (ulong)(local_5c0->super_ShaderRenderCase).m_isVertexCase;
  pcVar9 = "gl_FragColor";
  if (uVar18 != 0) {
    pcVar9 = "v_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5d0,pcVar9,(uVar18 ^ 1) * 5 + 7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," = ",3);
  if (local_5c0->m_op - OP_PRE_INCREMENT < 4) {
    pSVar25 = (ShaderMatrixCase *)0x1bff9b7;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_(&local_498,pSVar25,&local_5c4,"res");
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_498._M_dataplus._M_p,local_498._M_string_length)
    ;
    pcVar9 = ", 1.0) + vec4(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", 1.0) + vec4(",0xe);
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_5b0,(ShaderMatrixCase *)pcVar9,&local_5c4,"tmpValue");
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", 0.0);\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pSVar25 = (ShaderMatrixCase *)0x1bff9b7;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_(&local_498,pSVar25,&local_5c4,"res");
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5d0,local_498._M_dataplus._M_p,local_498._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", 1.0);\n",8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  pSVar25 = local_5c0;
  std::__cxx11::string::operator=
            ((string *)&(local_5c0->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_498)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar25->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(local_5c0->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  pSVar25 = local_5c0;
  pfVar4 = (float *)(this_00->
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  pfVar22 = pfVar4;
  pEVar21 = (EVP_PKEY_CTX *)0x0;
  do {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    lVar31 = 0;
    psVar19 = &local_498;
    do {
      lVar32 = 0;
      do {
        *(undefined4 *)((long)&(psVar19->_M_dataplus)._M_p + lVar32) = 0;
        lVar32 = lVar32 + 0x10;
      } while (lVar32 != 0x40);
      lVar31 = lVar31 + 1;
      psVar19 = (string *)((long)&(psVar19->_M_dataplus)._M_p + 4);
    } while (lVar31 != 4);
    lVar31 = 0;
    psVar19 = &local_498;
    pfVar27 = pfVar22;
    do {
      lVar32 = 0;
      do {
        *(undefined4 *)((long)pfVar27 + lVar32) =
             *(undefined4 *)((long)&(psVar19->_M_dataplus)._M_p + lVar32);
        lVar32 = lVar32 + 0x10;
      } while (lVar32 != 0x40);
      lVar31 = lVar31 + 1;
      pfVar27 = pfVar27 + 1;
      psVar19 = (string *)((long)&(psVar19->_M_dataplus)._M_p + 4);
    } while (lVar31 != 4);
    pfVar4[(long)pEVar21 * 0x11] = 1.0;
    ctx_00 = pEVar21 + 1;
    pfVar4[(long)pEVar21 * 0x10 + (ulong)((uint)ctx_00 & 3) + 4] = 1.0;
    pfVar4[(long)pEVar21 * 0x10 + ((ulong)pEVar21 & 0xffffffff ^ 2) + 8] = 1.0;
    pfVar4[(long)pEVar21 * 0x10 + (ulong)((int)pEVar21 - 1U & 3) + 0xc] = 1.0;
    pfVar22 = pfVar22 + 0x10;
    pEVar21 = ctx_00;
  } while (ctx_00 != (EVP_PKEY_CTX *)&DAT_00000004);
  TVar7 = MatrixCaseUtils::getOperationTestMatrixType(local_5c0->m_op);
  if (TVar7 != TESTMATRIXTYPE_DEFAULT) {
    pEVar21 = (EVP_PKEY_CTX *)0x0;
    lVar31 = 0;
    do {
      lVar32 = 0;
      ctx_00 = pEVar21;
      do {
        pMVar5 = (this_00->
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar28 = 0;
        do {
          if (TVar7 == TESTMATRIXTYPE_DECREMENTED) {
            fVar37 = *(float *)(ctx_00 + (long)(pMVar5->m_data).m_data[0].m_data + lVar28) + -0.1;
LAB_00effc47:
            *(float *)(ctx_00 + (long)(pMVar5->m_data).m_data[0].m_data + lVar28) = fVar37;
          }
          else {
            if (TVar7 == TESTMATRIXTYPE_INCREMENTED) {
              fVar37 = *(float *)(ctx_00 + (long)(pMVar5->m_data).m_data[0].m_data + lVar28) + 0.3;
              goto LAB_00effc47;
            }
            if (TVar7 == TESTMATRIXTYPE_NEGATED) {
              fVar37 = -*(float *)(ctx_00 + (long)(pMVar5->m_data).m_data[0].m_data + lVar28);
              goto LAB_00effc47;
            }
          }
          lVar28 = lVar28 + 0x10;
        } while (lVar28 != 0x40);
        lVar32 = lVar32 + 1;
        ctx_00 = ctx_00 + 4;
      } while (lVar32 != 4);
      lVar31 = lVar31 + 1;
      pEVar21 = pEVar21 + 0x40;
    } while (lVar31 != 4);
  }
  deqp::gls::ShaderRenderCase::init(&pSVar25->super_ShaderRenderCase,ctx_00);
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_528);
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar8 = std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return iVar8;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = otherType;
		}
	}

	vtx << "attribute highp vec4 a_position;\n";
	if (m_isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "attribute " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_coords;\n";
					frag << "varying " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2[inNdx]));		break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3[inNdx]));		break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
	{
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified.
	op << "	" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}